

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

void rtr_pdu_convert_footer_byte_order(void *pdu,target_byte_order target_byte_order)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint value;
  ulong uVar3;
  long in_FS_OFFSET;
  uint32_t addr6 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(*(undefined1 *)((long)pdu + 1)) {
  case 4:
    lrtr_ipv4_addr_convert_byte_order
              (*(uint32_t *)((long)pdu + 0xc),(uint32_t *)((long)pdu + 0xc),target_byte_order);
    uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0x10));
    *(uint32_t *)((long)pdu + 0x10) = uVar2;
    break;
  case 6:
    lrtr_ipv6_addr_convert_byte_order
              ((uint32_t *)((long)pdu + 0xc),(uint32_t *)&local_38,target_byte_order);
    *(undefined8 *)((long)pdu + 0xc) = local_38;
    *(undefined8 *)((long)pdu + 0x14) = uStack_30;
  case 9:
    uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0x1c));
    *(uint32_t *)((long)pdu + 0x1c) = uVar2;
    break;
  case 7:
    if ((byte)(*pdu - 1U) < 2) {
      uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0x14));
      *(uint32_t *)((long)pdu + 0x14) = uVar2;
      uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0xc));
      *(uint32_t *)((long)pdu + 0xc) = uVar2;
      uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0x10));
      *(uint32_t *)((long)pdu + 0x10) = uVar2;
    }
  case 0:
  case 1:
    value = *(uint32_t *)((long)pdu + 8);
LAB_0010aae2:
    uVar2 = lrtr_convert_long(target_byte_order,value);
    *(uint32_t *)((long)pdu + 8) = uVar2;
    break;
  case 10:
    if (target_byte_order != TO_NETWORK_BYTE_ORDER) {
      uVar2 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,*(uint32_t *)((long)pdu + 8));
      *(uint32_t *)((long)pdu + 8) = uVar2;
      uVar2 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,
                                *(uint32_t *)((long)pdu + (ulong)uVar2 + 0xc));
      *(uint32_t *)((long)pdu + (ulong)*(uint *)((long)pdu + 8) + 0xc) = uVar2;
      break;
    }
    uVar2 = lrtr_convert_long(TO_NETWORK_BYTE_ORDER,
                              *(uint32_t *)((long)pdu + (ulong)*(uint *)((long)pdu + 8) + 0xc));
    value = *(uint *)((long)pdu + 8);
    *(uint32_t *)((long)pdu + (ulong)value + 0xc) = uVar2;
    target_byte_order = TO_NETWORK_BYTE_ORDER;
    goto LAB_0010aae2;
  case 0xb:
    uVar1 = lrtr_convert_short(target_byte_order,*(uint16_t *)((long)pdu + 10));
    *(uint16_t *)((long)pdu + 10) = uVar1;
    uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + 0xc));
    *(uint32_t *)((long)pdu + 0xc) = uVar2;
    uVar1 = *(uint16_t *)((long)pdu + 10);
    if (target_byte_order != TO_HOST_HOST_BYTE_ORDER) {
      uVar1 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,uVar1);
    }
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = lrtr_convert_long(target_byte_order,*(uint32_t *)((long)pdu + uVar3 * 4 + 0x10));
        *(uint32_t *)((long)pdu + uVar3 * 4 + 0x10) = uVar2;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtr_pdu_convert_footer_byte_order(void *pdu, const enum target_byte_order target_byte_order)
{
	struct pdu_error *err_pdu;
	struct pdu_header *header = pdu;
	uint32_t addr6[4];
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	switch (type) {
	case SERIAL_QUERY:
		((struct pdu_serial_query *)pdu)->sn =
			lrtr_convert_long(target_byte_order, ((struct pdu_serial_query *)pdu)->sn);
		break;

	case ERROR:
		err_pdu = (struct pdu_error *)pdu;
		if (target_byte_order == TO_NETWORK_BYTE_ORDER) {
			*((uint32_t *)(err_pdu->rest + err_pdu->len_enc_pdu)) = lrtr_convert_long(
				target_byte_order, *((uint32_t *)(err_pdu->rest + err_pdu->len_enc_pdu)));
			err_pdu->len_enc_pdu = lrtr_convert_long(target_byte_order, err_pdu->len_enc_pdu);
		} else {
			err_pdu->len_enc_pdu = lrtr_convert_long(target_byte_order, err_pdu->len_enc_pdu);
			*((uint32_t *)(err_pdu->rest + err_pdu->len_enc_pdu)) = lrtr_convert_long(
				target_byte_order, *((uint32_t *)(err_pdu->rest + err_pdu->len_enc_pdu)));
		}
		break;

	case SERIAL_NOTIFY:
		((struct pdu_serial_notify *)pdu)->sn =
			lrtr_convert_long(target_byte_order, ((struct pdu_serial_notify *)pdu)->sn);
		break;

	case EOD:
		if (header->ver == RTR_PROTOCOL_VERSION_1 || header->ver == RTR_PROTOCOL_VERSION_2) {
			((struct pdu_end_of_data_v1_v2 *)pdu)->expire_interval = lrtr_convert_long(
				target_byte_order, ((struct pdu_end_of_data_v1_v2 *)pdu)->expire_interval);

			((struct pdu_end_of_data_v1_v2 *)pdu)->refresh_interval = lrtr_convert_long(
				target_byte_order, ((struct pdu_end_of_data_v1_v2 *)pdu)->refresh_interval);

			((struct pdu_end_of_data_v1_v2 *)pdu)->retry_interval = lrtr_convert_long(
				target_byte_order, ((struct pdu_end_of_data_v1_v2 *)pdu)->retry_interval);

			((struct pdu_end_of_data_v1_v2 *)pdu)->sn =
				lrtr_convert_long(target_byte_order, ((struct pdu_end_of_data_v1_v2 *)pdu)->sn);
		} else {
			((struct pdu_end_of_data_v0 *)pdu)->sn =
				lrtr_convert_long(target_byte_order, ((struct pdu_end_of_data_v0 *)pdu)->sn);
		}
		break;

	case IPV4_PREFIX:
		lrtr_ipv4_addr_convert_byte_order(((struct pdu_ipv4 *)pdu)->prefix, &((struct pdu_ipv4 *)pdu)->prefix,
						  target_byte_order);
		((struct pdu_ipv4 *)pdu)->asn = lrtr_convert_long(target_byte_order, ((struct pdu_ipv4 *)pdu)->asn);
		break;

	case IPV6_PREFIX:
		lrtr_ipv6_addr_convert_byte_order(((struct pdu_ipv6 *)pdu)->prefix, addr6, target_byte_order);
		memcpy(((struct pdu_ipv6 *)pdu)->prefix, addr6, sizeof(addr6));
		((struct pdu_ipv6 *)pdu)->asn = lrtr_convert_long(target_byte_order, ((struct pdu_ipv6 *)pdu)->asn);
		break;

	case ROUTER_KEY:
		((struct pdu_router_key *)pdu)->asn =
			lrtr_convert_long(target_byte_order, ((struct pdu_router_key *)pdu)->asn);
		break;

	case ASPA:
		((struct pdu_aspa *)pdu)->provider_count =
			lrtr_convert_short(target_byte_order, ((struct pdu_aspa *)pdu)->provider_count);
		((struct pdu_aspa *)pdu)->customer_asn =
			lrtr_convert_long(target_byte_order, ((struct pdu_aspa *)pdu)->customer_asn);

		uint16_t asn_count = ((struct pdu_aspa *)pdu)->provider_count;

		// prevent converting twice
		if (target_byte_order != TO_HOST_HOST_BYTE_ORDER)
			asn_count = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER, asn_count);

		for (size_t i = 0; i < asn_count; i++) {
			((struct pdu_aspa *)pdu)->provider_asns[i] =
				lrtr_convert_long(target_byte_order, ((struct pdu_aspa *)pdu)->provider_asns[i]);
		}
		break;

	default:
		break;
	}
}